

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix3d>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,matrix3d *v)

{
  bool bVar1;
  pointer pSVar2;
  value_type *pvVar3;
  pointer pSVar4;
  long lVar5;
  long lVar6;
  storage_t<tinyusdz::value::matrix3d> *psVar7;
  storage_t<tinyusdz::value::matrix3d> *psVar8;
  byte bVar9;
  optional<tinyusdz::value::matrix3d> pv;
  optional<tinyusdz::value::matrix3d> local_70;
  
  bVar9 = 0;
  if (v == (matrix3d *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_default_value<tinyusdz::value::matrix3d>(&local_70,this);
    pv.has_value_ = local_70.has_value_;
    if (local_70.has_value_ == true) goto LAB_001ae747;
    pSVar2 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar2 == pSVar4) {
      return false;
    }
  }
  else {
    pSVar2 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar4 != pSVar2) {
    bVar1 = tinyusdz::value::TimeSamples::get<tinyusdz::value::matrix3d,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar1;
  }
  bVar1 = has_value(this);
  if (bVar1) {
    get_default_value<tinyusdz::value::matrix3d>(&local_70,this);
    pv.has_value_ = local_70.has_value_;
    if (local_70.has_value_ != false) {
LAB_001ae747:
      lVar6 = 9;
      psVar7 = &local_70.contained;
      psVar8 = &pv.contained;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined8 *)psVar8 = *(undefined8 *)psVar7;
        psVar7 = (storage_t<tinyusdz::value::matrix3d> *)
                 ((long)psVar7 + ((ulong)bVar9 * -2 + 1) * 8);
        psVar8 = (storage_t<tinyusdz::value::matrix3d> *)((long)psVar8 + (ulong)bVar9 * -0x10 + 8);
      }
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::matrix3d>::value(&pv);
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        v->m[0][0] = pvVar3->m[0][0];
        pvVar3 = (value_type *)((long)pvVar3 + ((ulong)bVar9 * -2 + 1) * 8);
        v = (matrix3d *)((long)v + ((ulong)bVar9 * -2 + 1) * 8);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }